

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

long __thiscall Vector::extractMin(Vector *this,VectorDouble *values)

{
  long lVar1;
  VectorDouble *in_RSI;
  Vector *in_RDI;
  double dVar2;
  double try_value;
  unsigned_long i;
  long best_index;
  double current_min;
  char *local_30;
  char *local_28;
  double local_20;
  char *local_8;
  
  local_20 = 1.79769313486232e+308;
  local_28 = (char *)0xffffffffffffffff;
  for (local_30 = (char *)0x0; local_30 < (char *)in_RDI->vLength; local_30 = local_30 + 1) {
    dVar2 = VectorDouble::value(in_RSI,in_RDI->vData[(long)local_30]);
    if (dVar2 < local_20) {
      local_28 = local_30;
      local_20 = dVar2;
    }
  }
  if ((long)local_28 < 0) {
    local_8 = local_28;
  }
  else {
    lVar1 = in_RDI->vData[(long)local_28];
    remove(in_RDI,local_28);
    local_8 = (char *)(long)(double)lVar1;
  }
  return (long)local_8;
}

Assistant:

long Vector::extractMin(VectorDouble &values) {
  double current_min = DBL_MAX;
  long best_index = -1;

  for (unsigned long i = 0; i < vLength; i++) {
    double try_value = values.value(vData[i]);
    if (try_value < current_min) {
      best_index = i;
      current_min = try_value;
    }
  }

  if (best_index >= 0) {
    current_min = vData[best_index];
    remove(best_index);
    return current_min;
  }

  return best_index;
}